

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_h_predictor_64x64_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [16];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  short sVar12;
  short sVar14;
  undefined1 auVar13 [16];
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  short sVar31;
  ushort uVar32;
  ushort uVar33;
  short sVar35;
  ushort uVar36;
  ushort uVar37;
  short sVar38;
  ushort uVar39;
  ushort uVar40;
  short sVar41;
  ushort uVar42;
  ushort uVar43;
  short sVar44;
  ushort uVar45;
  ushort uVar46;
  short sVar47;
  ushort uVar48;
  ushort uVar49;
  short sVar50;
  ushort uVar51;
  ushort uVar52;
  undefined1 auVar34 [16];
  short sVar53;
  ushort uVar54;
  ushort uVar55;
  undefined1 auVar56 [16];
  
  auVar13 = pshuflw(ZEXT116(top_row[0x3f]),ZEXT116(top_row[0x3f]),0);
  sVar12 = auVar13._0_2_;
  sVar14 = auVar13._2_2_;
  uVar9 = 0;
  do {
    uVar1 = *(ulong *)(left_column + uVar9);
    auVar2._8_6_ = 0;
    auVar2._0_8_ = uVar1;
    auVar2[0xe] = (char)(uVar1 >> 0x38);
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar1;
    auVar4[0xc] = (char)(uVar1 >> 0x30);
    auVar4._13_2_ = auVar2._13_2_;
    auVar5._8_4_ = 0;
    auVar5._0_8_ = uVar1;
    auVar5._12_3_ = auVar4._12_3_;
    auVar6._8_2_ = 0;
    auVar6._0_8_ = uVar1;
    auVar6[10] = (char)(uVar1 >> 0x28);
    auVar6._11_4_ = auVar5._11_4_;
    auVar7._8_2_ = 0;
    auVar7._0_8_ = uVar1;
    auVar7._10_5_ = auVar6._10_5_;
    auVar8[8] = (char)(uVar1 >> 0x20);
    auVar8._0_8_ = uVar1;
    auVar8._9_6_ = auVar7._9_6_;
    auVar3._1_9_ = SUB169(ZEXT716(auVar8._8_7_) << 0x40,7);
    auVar3[0] = (char)(uVar1 >> 0x18);
    auVar3._10_6_ = 0;
    auVar13._1_11_ = SUB1611(auVar3 << 0x30,5);
    auVar13[0] = (char)(uVar1 >> 0x10);
    auVar13._12_4_ = 0;
    auVar56._3_13_ = SUB1613(auVar13 << 0x20,3);
    auVar56[2] = (char)(uVar1 >> 8);
    auVar56[0] = (byte)uVar1;
    auVar56[1] = 0;
    uVar10 = 0xfefdfefe;
    do {
      uVar10 = uVar10 + 0x2020202;
      auVar34._4_4_ = uVar10;
      auVar34._0_4_ = uVar10;
      auVar34._8_4_ = uVar10;
      auVar34._12_4_ = uVar10;
      auVar13 = pshufb(auVar56,auVar34);
      sVar31 = auVar13._0_2_;
      sVar35 = auVar13._2_2_;
      sVar38 = auVar13._4_2_;
      sVar41 = auVar13._6_2_;
      sVar44 = auVar13._8_2_;
      sVar47 = auVar13._10_2_;
      sVar50 = auVar13._12_2_;
      sVar53 = auVar13._14_2_;
      uVar32 = sVar31 * 0xff + sVar12 + 0x80;
      uVar36 = sVar35 * 0xf8 + sVar14 * 8 + 0x80;
      uVar39 = sVar38 * 0xf0 + sVar12 * 0x10 + 0x80;
      uVar42 = sVar41 * 0xe9 + sVar14 * 0x17 + 0x80;
      uVar45 = sVar44 * 0xe1 + sVar12 * 0x1f + 0x80;
      uVar48 = sVar47 * 0xda + sVar14 * 0x26 + 0x80;
      uVar51 = sVar50 * 0xd2 + sVar12 * 0x2e + 0x80;
      uVar54 = sVar53 * 0xcb + sVar14 * 0x35 + 0x80;
      uVar15 = sVar31 * 0xc4 + sVar12 * 0x3c + 0x80;
      uVar17 = sVar35 * 0xbd + sVar14 * 0x43 + 0x80;
      uVar19 = sVar38 * 0xb6 + sVar12 * 0x4a + 0x80;
      uVar21 = sVar41 * 0xb0 + sVar14 * 0x50 + 0x80;
      uVar23 = sVar44 * 0xa9 + sVar12 * 0x57 + 0x80;
      uVar25 = sVar47 * 0xa3 + sVar14 * 0x5d + 0x80;
      uVar27 = sVar50 * 0x9c + sVar12 * 100 + 0x80;
      uVar29 = sVar53 * 0x96 + sVar14 * 0x6a + 0x80;
      uVar33 = uVar32 >> 8;
      uVar37 = uVar36 >> 8;
      uVar40 = uVar39 >> 8;
      uVar43 = uVar42 >> 8;
      uVar46 = uVar45 >> 8;
      uVar49 = uVar48 >> 8;
      uVar52 = uVar51 >> 8;
      uVar55 = uVar54 >> 8;
      uVar16 = uVar15 >> 8;
      uVar18 = uVar17 >> 8;
      uVar20 = uVar19 >> 8;
      uVar22 = uVar21 >> 8;
      uVar24 = uVar23 >> 8;
      uVar26 = uVar25 >> 8;
      uVar28 = uVar27 >> 8;
      uVar30 = uVar29 >> 8;
      *dst = (uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33);
      dst[1] = (uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37);
      dst[2] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
      dst[3] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
      dst[4] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46);
      dst[5] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
      dst[6] = (uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52);
      dst[7] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
      dst[8] = (uVar16 != 0) * (uVar16 < 0x100) * (char)(uVar15 >> 8) - (0xff < uVar16);
      dst[9] = (uVar18 != 0) * (uVar18 < 0x100) * (char)(uVar17 >> 8) - (0xff < uVar18);
      dst[10] = (uVar20 != 0) * (uVar20 < 0x100) * (char)(uVar19 >> 8) - (0xff < uVar20);
      dst[0xb] = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar21 >> 8) - (0xff < uVar22);
      dst[0xc] = (uVar24 != 0) * (uVar24 < 0x100) * (char)(uVar23 >> 8) - (0xff < uVar24);
      dst[0xd] = (uVar26 != 0) * (uVar26 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar26);
      dst[0xe] = (uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) - (0xff < uVar28);
      dst[0xf] = (uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30);
      uVar15 = sVar31 * 0x90 + sVar12 * 0x70 + 0x80;
      uVar17 = sVar35 * 0x8a + sVar14 * 0x76 + 0x80;
      uVar19 = sVar38 * 0x85 + sVar12 * 0x7b + 0x80;
      uVar21 = sVar41 * 0x7f + sVar14 * 0x81 + 0x80;
      uVar23 = sVar44 * 0x79 + sVar12 * 0x87 + 0x80;
      uVar25 = sVar47 * 0x74 + sVar14 * 0x8c + 0x80;
      uVar27 = sVar50 * 0x6f + sVar12 * 0x91 + 0x80;
      uVar29 = sVar53 * 0x6a + sVar14 * 0x96 + 0x80;
      uVar32 = sVar31 * 0x65 + sVar12 * 0x9b + 0x80;
      uVar36 = sVar35 * 0x60 + sVar14 * 0xa0 + 0x80;
      uVar39 = sVar38 * 0x5b + sVar12 * 0xa5 + 0x80;
      uVar42 = sVar41 * 0x56 + sVar14 * 0xaa + 0x80;
      uVar45 = sVar44 * 0x52 + sVar12 * 0xae + 0x80;
      uVar48 = sVar47 * 0x4d + sVar14 * 0xb3 + 0x80;
      uVar51 = sVar50 * 0x49 + sVar12 * 0xb7 + 0x80;
      uVar54 = sVar53 * 0x45 + sVar14 * 0xbb + 0x80;
      uVar16 = uVar15 >> 8;
      uVar18 = uVar17 >> 8;
      uVar20 = uVar19 >> 8;
      uVar22 = uVar21 >> 8;
      uVar24 = uVar23 >> 8;
      uVar26 = uVar25 >> 8;
      uVar28 = uVar27 >> 8;
      uVar30 = uVar29 >> 8;
      uVar33 = uVar32 >> 8;
      uVar37 = uVar36 >> 8;
      uVar40 = uVar39 >> 8;
      uVar43 = uVar42 >> 8;
      uVar46 = uVar45 >> 8;
      uVar49 = uVar48 >> 8;
      uVar52 = uVar51 >> 8;
      uVar55 = uVar54 >> 8;
      dst[0x10] = (uVar16 != 0) * (uVar16 < 0x100) * (char)(uVar15 >> 8) - (0xff < uVar16);
      dst[0x11] = (uVar18 != 0) * (uVar18 < 0x100) * (char)(uVar17 >> 8) - (0xff < uVar18);
      dst[0x12] = (uVar20 != 0) * (uVar20 < 0x100) * (char)(uVar19 >> 8) - (0xff < uVar20);
      dst[0x13] = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar21 >> 8) - (0xff < uVar22);
      dst[0x14] = (uVar24 != 0) * (uVar24 < 0x100) * (char)(uVar23 >> 8) - (0xff < uVar24);
      dst[0x15] = (uVar26 != 0) * (uVar26 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar26);
      dst[0x16] = (uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) - (0xff < uVar28);
      dst[0x17] = (uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30);
      dst[0x18] = (uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33);
      dst[0x19] = (uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37);
      dst[0x1a] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
      dst[0x1b] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
      dst[0x1c] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46);
      dst[0x1d] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
      dst[0x1e] = (uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52);
      dst[0x1f] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
      uVar15 = sVar31 * 0x41 + sVar12 * 0xbf + 0x80;
      uVar17 = sVar35 * 0x3d + sVar14 * 0xc3 + 0x80;
      uVar19 = sVar38 * 0x39 + sVar12 * 199 + 0x80;
      uVar21 = sVar41 * 0x36 + sVar14 * 0xca + 0x80;
      uVar23 = sVar44 * 0x32 + sVar12 * 0xce + 0x80;
      uVar25 = sVar47 * 0x2f + sVar14 * 0xd1 + 0x80;
      uVar27 = sVar50 * 0x2c + sVar12 * 0xd4 + 0x80;
      uVar29 = sVar53 * 0x29 + sVar14 * 0xd7 + 0x80;
      uVar32 = sVar31 * 0x26 + sVar12 * 0xda + 0x80;
      uVar36 = sVar35 * 0x23 + sVar14 * 0xdd + 0x80;
      uVar39 = sVar38 * 0x20 + sVar12 * 0xe0 + 0x80;
      uVar42 = sVar41 * 0x1d + sVar14 * 0xe3 + 0x80;
      uVar45 = sVar44 * 0x1b + sVar12 * 0xe5 + 0x80;
      uVar48 = sVar47 * 0x19 + sVar14 * 0xe7 + 0x80;
      uVar51 = sVar50 * 0x16 + sVar12 * 0xea + 0x80;
      uVar54 = sVar53 * 0x14 + sVar14 * 0xec + 0x80;
      uVar16 = uVar15 >> 8;
      uVar18 = uVar17 >> 8;
      uVar20 = uVar19 >> 8;
      uVar22 = uVar21 >> 8;
      uVar24 = uVar23 >> 8;
      uVar26 = uVar25 >> 8;
      uVar28 = uVar27 >> 8;
      uVar30 = uVar29 >> 8;
      uVar33 = uVar32 >> 8;
      uVar37 = uVar36 >> 8;
      uVar40 = uVar39 >> 8;
      uVar43 = uVar42 >> 8;
      uVar46 = uVar45 >> 8;
      uVar49 = uVar48 >> 8;
      uVar52 = uVar51 >> 8;
      uVar55 = uVar54 >> 8;
      dst[0x20] = (uVar16 != 0) * (uVar16 < 0x100) * (char)(uVar15 >> 8) - (0xff < uVar16);
      dst[0x21] = (uVar18 != 0) * (uVar18 < 0x100) * (char)(uVar17 >> 8) - (0xff < uVar18);
      dst[0x22] = (uVar20 != 0) * (uVar20 < 0x100) * (char)(uVar19 >> 8) - (0xff < uVar20);
      dst[0x23] = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar21 >> 8) - (0xff < uVar22);
      dst[0x24] = (uVar24 != 0) * (uVar24 < 0x100) * (char)(uVar23 >> 8) - (0xff < uVar24);
      dst[0x25] = (uVar26 != 0) * (uVar26 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar26);
      dst[0x26] = (uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) - (0xff < uVar28);
      dst[0x27] = (uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30);
      dst[0x28] = (uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33);
      dst[0x29] = (uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37);
      dst[0x2a] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
      dst[0x2b] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
      dst[0x2c] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46);
      dst[0x2d] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
      dst[0x2e] = (uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52);
      dst[0x2f] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
      uVar15 = sVar31 * 0x12 + sVar12 * 0xee + 0x80;
      uVar17 = sVar35 * 0x10 + sVar14 * 0xf0 + 0x80;
      uVar19 = sVar38 * 0xf + sVar12 * 0xf1 + 0x80;
      uVar21 = sVar41 * 0xd + sVar14 * 0xf3 + 0x80;
      uVar23 = sVar44 * 0xc + sVar12 * 0xf4 + 0x80;
      uVar25 = sVar47 * 10 + sVar14 * 0xf6 + 0x80;
      uVar27 = sVar50 * 9 + sVar12 * 0xf7 + 0x80;
      uVar29 = sVar53 * 8 + sVar14 * 0xf8 + 0x80;
      uVar32 = sVar31 * 7 + sVar12 * 0xf9 + 0x80;
      uVar36 = sVar35 * 6 + sVar14 * 0xfa + 0x80;
      uVar39 = sVar38 * 6 + sVar12 * 0xfa + 0x80;
      uVar42 = sVar41 * 5 + sVar14 * 0xfb + 0x80;
      uVar45 = sVar44 * 5 + sVar12 * 0xfb + 0x80;
      uVar48 = sVar47 * 4 + sVar14 * 0xfc + 0x80;
      uVar51 = sVar50 * 4 + sVar12 * 0xfc + 0x80;
      uVar54 = sVar53 * 4 + sVar14 * 0xfc + 0x80;
      uVar16 = uVar15 >> 8;
      uVar18 = uVar17 >> 8;
      uVar20 = uVar19 >> 8;
      uVar22 = uVar21 >> 8;
      uVar24 = uVar23 >> 8;
      uVar26 = uVar25 >> 8;
      uVar28 = uVar27 >> 8;
      uVar30 = uVar29 >> 8;
      uVar33 = uVar32 >> 8;
      uVar37 = uVar36 >> 8;
      uVar40 = uVar39 >> 8;
      uVar43 = uVar42 >> 8;
      uVar46 = uVar45 >> 8;
      uVar49 = uVar48 >> 8;
      uVar52 = uVar51 >> 8;
      uVar55 = uVar54 >> 8;
      dst[0x30] = (uVar16 != 0) * (uVar16 < 0x100) * (char)(uVar15 >> 8) - (0xff < uVar16);
      dst[0x31] = (uVar18 != 0) * (uVar18 < 0x100) * (char)(uVar17 >> 8) - (0xff < uVar18);
      dst[0x32] = (uVar20 != 0) * (uVar20 < 0x100) * (char)(uVar19 >> 8) - (0xff < uVar20);
      dst[0x33] = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar21 >> 8) - (0xff < uVar22);
      dst[0x34] = (uVar24 != 0) * (uVar24 < 0x100) * (char)(uVar23 >> 8) - (0xff < uVar24);
      dst[0x35] = (uVar26 != 0) * (uVar26 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar26);
      dst[0x36] = (uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) - (0xff < uVar28);
      dst[0x37] = (uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30);
      dst[0x38] = (uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33);
      dst[0x39] = (uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37);
      dst[0x3a] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
      dst[0x3b] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
      dst[0x3c] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46);
      dst[0x3d] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
      dst[0x3e] = (uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52);
      dst[0x3f] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
      dst = dst + stride;
    } while (uVar10 < 0xd0c0d0d);
    bVar11 = uVar9 < 0x38;
    uVar9 = uVar9 + 8;
  } while (bVar11);
  return;
}

Assistant:

void aom_smooth_h_predictor_64x64_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[63]);
  const __m128i weights_lolo = LoadUnaligned16(smooth_weights + 60);
  const __m128i weights_lohi = LoadUnaligned16(smooth_weights + 76);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights_lolo);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights_lolo, 8));
  const __m128i weights3 = cvtepu8_epi16(weights_lohi);
  const __m128i weights4 = cvtepu8_epi16(_mm_srli_si128(weights_lohi, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i scaled_top_right3 =
      _mm_mullo_epi16(inverted_weights3, top_right);
  const __m128i scaled_top_right4 =
      _mm_mullo_epi16(inverted_weights4, top_right);
  const __m128i weights_hilo = LoadUnaligned16(smooth_weights + 92);
  const __m128i weights_hihi = LoadUnaligned16(smooth_weights + 108);
  const __m128i weights5 = cvtepu8_epi16(weights_hilo);
  const __m128i weights6 = cvtepu8_epi16(_mm_srli_si128(weights_hilo, 8));
  const __m128i weights7 = cvtepu8_epi16(weights_hihi);
  const __m128i weights8 = cvtepu8_epi16(_mm_srli_si128(weights_hihi, 8));
  const __m128i inverted_weights5 = _mm_sub_epi16(scale, weights5);
  const __m128i inverted_weights6 = _mm_sub_epi16(scale, weights6);
  const __m128i inverted_weights7 = _mm_sub_epi16(scale, weights7);
  const __m128i inverted_weights8 = _mm_sub_epi16(scale, weights8);
  const __m128i scaled_top_right5 =
      _mm_mullo_epi16(inverted_weights5, top_right);
  const __m128i scaled_top_right6 =
      _mm_mullo_epi16(inverted_weights6, top_right);
  const __m128i scaled_top_right7 =
      _mm_mullo_epi16(inverted_weights7, top_right);
  const __m128i scaled_top_right8 =
      _mm_mullo_epi16(inverted_weights8, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int left_offset = 0; left_offset < 64; left_offset += 8) {
    const __m128i left = cvtepu8_epi16(LoadLo8(left_column + left_offset));
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i left_y = _mm_shuffle_epi8(left, y_select);
      write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                     scaled_top_right1, scaled_top_right2,
                                     round);
      write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3,
                                     weights4, scaled_top_right3,
                                     scaled_top_right4, round);
      write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5,
                                     weights6, scaled_top_right5,
                                     scaled_top_right6, round);
      write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7,
                                     weights8, scaled_top_right7,
                                     scaled_top_right8, round);
      dst += stride;
    }
  }
}